

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::DDLNodeTest_accessDataArrayListTest_Test::~DDLNodeTest_accessDataArrayListTest_Test
          (DDLNodeTest_accessDataArrayListTest_Test *this)

{
  DDLNodeTest_accessDataArrayListTest_Test *this_local;
  
  ~DDLNodeTest_accessDataArrayListTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, accessDataArrayListTest) {
    DDLNode *myNode = DDLNode::create("test", "name");
    ASSERT_FALSE(nullptr == myNode);
    EXPECT_TRUE(nullptr == myNode->getDataArrayList());

    DataArrayList *dtArrayList(new DataArrayList);
    myNode->setDataArrayList(dtArrayList);
    EXPECT_EQ(dtArrayList, myNode->getDataArrayList());
    delete myNode;
}